

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_do_button_text(nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *string,int len
                         ,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
                         nk_input *in,nk_user_font *font)

{
  uint state_00;
  undefined4 in_EAX;
  int iVar1;
  nk_bool nVar2;
  nk_style_item *pnVar3;
  nk_color *pnVar4;
  undefined1 auVar5 [16];
  nk_text local_60;
  nk_rect local_50;
  nk_rect local_40;
  
  auVar5._0_4_ = -(uint)(out == (nk_command_buffer *)0x0);
  auVar5._4_4_ = -(uint)(style == (nk_style_button *)0x0);
  auVar5._8_4_ = -(uint)(font == (nk_user_font *)0x0);
  auVar5._12_4_ = -(uint)(string == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar5);
  nVar2 = 0;
  if (iVar1 == 0) {
    local_40 = bounds;
    nVar2 = nk_do_button(state,out,bounds,style,in,behavior,&local_50);
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    state_00 = *state;
    pnVar3 = nk_draw_button(out,&local_40,state_00,style);
    pnVar4 = &style->text_background;
    if (pnVar3->type == NK_STYLE_ITEM_COLOR) {
      pnVar4 = (nk_color *)&pnVar3->data;
    }
    local_60.background = *pnVar4;
    if ((state_00 & 0x10) == 0) {
      if ((state_00 & 0x20) == 0) {
        local_60.text = style->text_normal;
      }
      else {
        local_60.text = style->text_active;
      }
    }
    else {
      local_60.text = style->text_hover;
    }
    local_60.padding.x = 0.0;
    local_60.padding.y = 0.0;
    nk_widget_text(out,local_50,string,len,&local_60,align,font);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return nVar2;
}

Assistant:

NK_LIB nk_bool
nk_do_button_text(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
const char *string, int len, nk_flags align, enum nk_button_behavior behavior,
const struct nk_style_button *style, const struct nk_input *in,
const struct nk_user_font *font)
{
struct nk_rect content;
int ret = nk_false;

NK_ASSERT(state);
NK_ASSERT(style);
NK_ASSERT(out);
NK_ASSERT(string);
NK_ASSERT(font);
if (!out || !style || !font || !string)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_text(out, &bounds, &content, *state, style, string, len, align, font);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}